

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::createShader
          (DrawCallBatchingTest *this)

{
  RenderContext *renderCtx;
  bool bVar1;
  deBool dVar2;
  ostream *poVar3;
  ShaderProgram *this_00;
  ProgramSources *pPVar4;
  TestLog *log;
  TestError *this_01;
  string local_480;
  ShaderSource local_460;
  string local_438;
  ShaderSource local_418;
  ProgramSources local_3f0;
  int local_320;
  int local_31c;
  int attributeNdx_3;
  int attributeNdx_2;
  int iStack_310;
  bool first;
  int attributeNdx_1;
  int attributeNdx;
  ostringstream local_300 [8];
  ostringstream fragmentShader;
  ostringstream local_188 [8];
  ostringstream vertexShader;
  DrawCallBatchingTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::ostringstream::ostringstream(local_300);
  for (iStack_310 = 0; iStack_310 < (this->m_spec).staticAttributeCount; iStack_310 = iStack_310 + 1
      ) {
    poVar3 = std::operator<<((ostream *)local_188,"attribute mediump vec4 a_static");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iStack_310);
    std::operator<<(poVar3,";\n");
  }
  if ((0 < (this->m_spec).staticAttributeCount) && (0 < (this->m_spec).dynamicAttributeCount)) {
    std::operator<<((ostream *)local_188,"\n");
  }
  for (attributeNdx_2 = 0; attributeNdx_2 < (this->m_spec).dynamicAttributeCount;
      attributeNdx_2 = attributeNdx_2 + 1) {
    poVar3 = std::operator<<((ostream *)local_188,"attribute mediump vec4 a_dyn");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,attributeNdx_2);
    std::operator<<(poVar3,";\n");
  }
  poVar3 = std::operator<<((ostream *)local_188,"\n");
  poVar3 = std::operator<<(poVar3,"varying mediump vec4 v_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  std::operator<<(poVar3,"{\n");
  std::operator<<((ostream *)local_188,"\tv_color = ");
  attributeNdx_3._3_1_ = 1;
  for (local_31c = 0; local_31c < (this->m_spec).staticAttributeCount; local_31c = local_31c + 1) {
    if ((attributeNdx_3._3_1_ & 1) == 0) {
      std::operator<<((ostream *)local_188," + ");
    }
    attributeNdx_3._3_1_ = 0;
    poVar3 = std::operator<<((ostream *)local_188,"a_static");
    std::ostream::operator<<(poVar3,local_31c);
  }
  for (local_320 = 0; local_320 < (this->m_spec).dynamicAttributeCount; local_320 = local_320 + 1) {
    if ((attributeNdx_3._3_1_ & 1) == 0) {
      std::operator<<((ostream *)local_188," + ");
    }
    attributeNdx_3._3_1_ = 0;
    poVar3 = std::operator<<((ostream *)local_188,"a_dyn");
    std::ostream::operator<<(poVar3,local_320);
  }
  std::operator<<((ostream *)local_188,";\n");
  if ((this->m_spec).dynamicAttributeCount < 1) {
    std::operator<<((ostream *)local_188,"\tgl_Position = a_static0;\n");
  }
  else {
    std::operator<<((ostream *)local_188,"\tgl_Position = a_dyn0;\n");
  }
  std::operator<<((ostream *)local_188,"}");
  poVar3 = std::operator<<((ostream *)local_300,"varying mediump vec4 v_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tgl_FragColor = v_color;\n");
  std::operator<<(poVar3,"}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  glu::ProgramSources::ProgramSources(&local_3f0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_418,&local_438);
  pPVar4 = glu::ProgramSources::operator<<(&local_3f0,&local_418);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_460,&local_480);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_460);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar4);
  this->m_program = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  glu::VertexSource::~VertexSource((VertexSource *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  glu::ProgramSources::~ProgramSources(&local_3f0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  glu::operator<<(log,this->m_program);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = glu::ShaderProgram::isOk(this->m_program), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      std::__cxx11::ostringstream::~ostringstream(local_300);
      std::__cxx11::ostringstream::~ostringstream(local_188);
      return;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"m_program->isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
             ,0x106);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void DrawCallBatchingTest::createShader (void)
{
	std::ostringstream		vertexShader;
	std::ostringstream		fragmentShader;

	for (int attributeNdx = 0; attributeNdx < m_spec.staticAttributeCount; attributeNdx++)
		vertexShader << "attribute mediump vec4 a_static" << attributeNdx << ";\n";

	if (m_spec.staticAttributeCount > 0 && m_spec.dynamicAttributeCount > 0)
		vertexShader << "\n";

	for (int attributeNdx = 0; attributeNdx < m_spec.dynamicAttributeCount; attributeNdx++)
		vertexShader << "attribute mediump vec4 a_dyn" << attributeNdx << ";\n";

	vertexShader
	<< "\n"
	<< "varying mediump vec4 v_color;\n"
	<< "\n"
	<< "void main (void)\n"
	<< "{\n";

	vertexShader << "\tv_color = ";

	bool first = true;

	for (int attributeNdx = 0; attributeNdx < m_spec.staticAttributeCount; attributeNdx++)
	{
		if (!first)
			vertexShader << " + ";
		first = false;

		vertexShader << "a_static" << attributeNdx;
	}

	for (int attributeNdx = 0; attributeNdx < m_spec.dynamicAttributeCount; attributeNdx++)
	{
		if (!first)
			vertexShader << " + ";
		first = false;

		vertexShader << "a_dyn" << attributeNdx;
	}

	vertexShader << ";\n";

	if (m_spec.dynamicAttributeCount > 0)
		vertexShader << "\tgl_Position = a_dyn0;\n";
	else
		vertexShader << "\tgl_Position = a_static0;\n";

	vertexShader
	<< "}";

	fragmentShader
	<< "varying mediump vec4 v_color;\n"
	<< "\n"
	<< "void main(void)\n"
	<< "{\n"
	<< "\tgl_FragColor = v_color;\n"
	<< "}\n";

	m_program = new glu::ShaderProgram(m_renderCtx, glu::ProgramSources() << glu::VertexSource(vertexShader.str()) << glu::FragmentSource(fragmentShader.str()));

	m_testCtx.getLog() << (*m_program);
	TCU_CHECK(m_program->isOk());
}